

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::NotLookingAt_<kj::parse::CharGroup_>::operator()
          (NotLookingAt_<kj::parse::CharGroup_> *this,ParserInput *input)

{
  long in_RDX;
  undefined1 local_32 [10];
  Bits64 local_28;
  Bits64 local_20;
  Bits64 local_18;
  undefined8 local_10;
  
  local_28 = *(undefined8 *)(in_RDX + 8);
  local_20 = *(undefined8 *)(in_RDX + 0x10);
  local_10 = *(undefined8 *)(in_RDX + 0x20);
  local_32._2_8_ = 0;
  local_18 = local_28;
  CharGroup_::operator()((CharGroup_ *)local_32,input);
  *(byte *)(this->subParser).bits = local_32[0] ^ 1;
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)(local_32 + 2));
  return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
}

Assistant:

Maybe<Tuple<>> operator()(Input& input) const {
    Input subInput(input);
    subInput.forgetParent();
    if (subParser(subInput) == nullptr) {
      return Tuple<>();
    } else {
      return nullptr;
    }
  }